

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

bcf_hdr_t * bcf_hdr_subset(bcf_hdr_t *h0,int n,char **samples,int *imap)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  khint32_t *pkVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  kh_str2int_t *h;
  char *__haystack;
  bcf_hdr_t *hdr;
  char *pcVar8;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  char *pcVar12;
  byte bVar13;
  sbyte sVar14;
  uint uVar15;
  ulong uVar16;
  char *pcVar17;
  uint uVar18;
  uint uVar19;
  khint_t new_n_buckets;
  int iVar20;
  uint uVar21;
  kh_str2int_t *hash_1;
  bool bVar22;
  kh_str2int_t *hash;
  int hlen;
  ulong local_b0;
  ulong local_90;
  int local_54;
  ulong local_50;
  bcf_hdr_t *local_48;
  ulong local_40;
  int *local_38;
  
  h = (kh_str2int_t *)calloc(1,0x28);
  __haystack = bcf_hdr_fmt_text(h0,1,&local_54);
  hdr = bcf_hdr_init("w");
  local_48 = h0;
  pcVar8 = bcf_hdr_get_version(h0);
  bcf_hdr_set_version(hdr,pcVar8);
  if (0 < n) {
    memset(imap,0xff,(ulong)(uint)n << 2);
  }
  if (local_48->n[2] < 1) {
    local_b0 = (ulong)local_54;
    uVar16 = local_b0 + 1 >> 1 | local_b0 + 1;
    uVar16 = uVar16 >> 2 | uVar16;
    uVar16 = uVar16 >> 4 | uVar16;
    uVar16 = uVar16 >> 8 | uVar16;
    local_90 = (uVar16 >> 0x10 | uVar16) + 1;
    pcVar8 = (char *)malloc(local_90);
    if (pcVar8 != (char *)0x0) {
      memcpy(pcVar8,__haystack,local_b0);
      pcVar8[local_b0] = '\0';
      goto LAB_0011ea6e;
    }
    pcVar8 = (char *)0x0;
  }
  else {
    uVar18 = 8 - (n == 0);
    pcVar8 = strstr(__haystack,"#CHROM\t");
    pcVar8 = strchr(pcVar8,9);
    if (pcVar8 == (char *)0x0) {
LAB_0011e559:
      free(hdr);
      return (bcf_hdr_t *)0x0;
    }
    uVar19 = 1;
    local_38 = imap;
    do {
      pcVar8 = strchr(pcVar8 + 1,9);
      uVar15 = uVar19 + 1;
      if (pcVar8 == (char *)0x0) break;
      bVar22 = uVar19 < uVar18;
      uVar19 = uVar15;
    } while (bVar22);
    if (uVar15 - uVar18 != 1) goto LAB_0011e559;
    local_b0 = (ulong)((int)pcVar8 - (int)__haystack);
    uVar16 = local_b0 + 1 >> 1 | local_b0 + 1;
    uVar16 = uVar16 >> 2 | uVar16;
    uVar16 = uVar16 >> 4 | uVar16;
    uVar16 = uVar16 >> 8 | uVar16;
    local_90 = (uVar16 >> 0x10 | uVar16) + 1;
    pcVar8 = (char *)malloc(local_90);
    if (pcVar8 == (char *)0x0) {
      local_b0 = 0;
    }
    else {
      memcpy(pcVar8,__haystack,local_b0);
      pcVar8[local_b0] = '\0';
    }
    if (0 < n) {
      local_40 = (ulong)(uint)n;
      uVar16 = 0;
      do {
        pcVar12 = samples[uVar16];
        uVar18 = h->n_buckets;
        uVar19 = 0;
        if (uVar18 == 0) {
LAB_0011e6ed:
          if (uVar19 != uVar18) {
            fprintf(_stderr,"[E::bcf_hdr_subset] Duplicate sample name \"%s\".\n",pcVar12);
            free(pcVar8);
            free(__haystack);
            khash_str2int_destroy(h);
            bcf_hdr_destroy(hdr);
            return (bcf_hdr_t *)0x0;
          }
        }
        else {
          uVar15 = (uint)*pcVar12;
          if (*pcVar12 == '\0') {
            uVar15 = 0;
          }
          else {
            cVar5 = pcVar12[1];
            if (cVar5 != '\0') {
              pcVar17 = pcVar12 + 2;
              do {
                uVar15 = (int)cVar5 + uVar15 * 0x1f;
                cVar5 = *pcVar17;
                pcVar17 = pcVar17 + 1;
              } while (cVar5 != '\0');
            }
          }
          uVar15 = uVar15 & uVar18 - 1;
          pkVar4 = h->flags;
          iVar20 = 1;
          uVar19 = uVar15;
          do {
            uVar3 = pkVar4[uVar19 >> 4];
            bVar13 = (char)uVar19 * '\x02' & 0x1e;
            uVar6 = uVar3 >> bVar13;
            if (((uVar6 & 2) != 0) ||
               (((uVar6 & 1) == 0 && (iVar7 = strcmp(h->keys[uVar19],pcVar12), iVar7 == 0)))) {
              if ((uVar3 >> bVar13 & 3) != 0) {
                uVar19 = uVar18;
              }
              goto LAB_0011e6ed;
            }
            uVar19 = uVar19 + iVar20 & uVar18 - 1;
            iVar20 = iVar20 + 1;
          } while (uVar19 != uVar15);
        }
        iVar20 = bcf_hdr_id2int(local_48,2,pcVar12);
        local_38[uVar16] = iVar20;
        if (-1 < iVar20) {
          uVar11 = local_b0 + 1;
          pcVar12 = pcVar8;
          if (uVar11 < local_90) {
LAB_0011e79a:
            (pcVar12 + local_b0)[0] = '\t';
            (pcVar12 + local_b0)[1] = '\0';
            pcVar8 = pcVar12;
            local_b0 = uVar11;
          }
          else {
            uVar9 = uVar11 >> 1 | uVar11;
            uVar9 = uVar9 >> 2 | uVar9;
            uVar9 = uVar9 >> 4 | uVar9;
            uVar9 = uVar9 >> 8 | uVar9;
            local_90 = (uVar9 >> 0x10 | uVar9) + 1;
            pcVar12 = (char *)realloc(pcVar8,local_90);
            if (pcVar12 != (char *)0x0) goto LAB_0011e79a;
          }
          pcVar12 = samples[uVar16];
          sVar10 = strlen(pcVar12);
          sVar10 = (size_t)(int)sVar10;
          uVar11 = local_b0 + sVar10 + 1;
          pcVar17 = pcVar8;
          if (uVar11 < local_90) {
LAB_0011e814:
            pcVar8 = pcVar17;
            memcpy(pcVar8 + local_b0,pcVar12,sVar10);
            pcVar8[local_b0 + sVar10] = '\0';
            local_b0 = local_b0 + sVar10;
          }
          else {
            uVar11 = uVar11 >> 1 | uVar11;
            uVar11 = uVar11 >> 2 | uVar11;
            uVar11 = uVar11 >> 4 | uVar11;
            uVar11 = uVar11 >> 8 | uVar11;
            local_90 = (uVar11 >> 0x10 | uVar11) + 1;
            pcVar17 = (char *)realloc(pcVar8,local_90);
            if (pcVar17 != (char *)0x0) goto LAB_0011e814;
          }
          if (h != (kh_str2int_t *)0x0) {
            pcVar12 = samples[uVar16];
            if (h->n_occupied < h->upper_bound) {
LAB_0011e890:
              uVar18 = (uint)*pcVar12;
              if (*pcVar12 == '\0') {
                uVar18 = 0;
              }
              else {
                cVar5 = pcVar12[1];
                if (cVar5 != '\0') {
                  pcVar17 = pcVar12 + 2;
                  do {
                    uVar18 = (int)cVar5 + uVar18 * 0x1f;
                    cVar5 = *pcVar17;
                    pcVar17 = pcVar17 + 1;
                  } while (cVar5 != '\0');
                }
              }
              uVar11 = (ulong)h->n_buckets;
              uVar19 = h->n_buckets - 1;
              uVar18 = uVar18 & uVar19;
              pkVar4 = h->flags;
              if ((pkVar4[uVar18 >> 4] >> ((char)uVar18 * '\x02' & 0x1fU) & 2) == 0) {
                iVar20 = 1;
                uVar15 = uVar18;
                local_50 = uVar11;
                do {
                  uVar3 = pkVar4[uVar15 >> 4];
                  uVar21 = uVar15 * 2 & 0x1e;
                  sVar14 = (sbyte)uVar21;
                  uVar6 = uVar3 >> sVar14;
                  if (((uVar6 & 2) != 0) ||
                     (((uVar6 & 1) == 0 && (iVar7 = strcmp(h->keys[uVar15],pcVar12), iVar7 == 0))))
                  {
                    bVar22 = (uVar3 >> sVar14 & 2) == 0;
                    uVar19 = (uint)uVar11;
                    goto LAB_0011e9b7;
                  }
                  if ((uVar3 >> uVar21 & 1) != 0) {
                    uVar11 = (ulong)uVar15;
                  }
                  uVar15 = uVar15 + iVar20 & uVar19;
                  iVar20 = iVar20 + 1;
                } while (uVar15 != uVar18);
                bVar22 = true;
                uVar19 = (uint)local_50;
                uVar15 = uVar18;
                if ((uint)uVar11 == uVar19) {
LAB_0011e9b7:
                  if (uVar19 == (uint)local_50) {
                    uVar19 = uVar15;
                  }
                  if (bVar22) {
                    uVar19 = uVar15;
                  }
                  uVar11 = (ulong)uVar19;
                }
              }
              else {
                uVar11 = (ulong)uVar18;
              }
              uVar9 = uVar11 >> 4;
              uVar18 = pkVar4[uVar9];
              bVar13 = (char)uVar11 * '\x02' & 0x1e;
              if ((uVar18 >> bVar13 & 2) == 0) {
                if ((uVar18 >> bVar13 & 1) == 0) goto LAB_0011ea51;
                h->keys[uVar11] = pcVar12;
                pkVar4[uVar9] = uVar18 & ~(3 << bVar13);
                h->size = h->size + 1;
              }
              else {
                h->keys[uVar11] = pcVar12;
                pkVar4[uVar9] = uVar18 & ~(3 << bVar13);
                uVar1 = h->size;
                uVar2 = h->n_occupied;
                h->size = uVar1 + 1;
                h->n_occupied = uVar2 + 1;
              }
            }
            else {
              uVar18 = h->n_buckets;
              if (h->size * 2 < uVar18) {
                new_n_buckets = uVar18 - 1;
              }
              else {
                new_n_buckets = uVar18 + 1;
              }
              iVar20 = kh_resize_str2int(h,new_n_buckets);
              if (-1 < iVar20) goto LAB_0011e890;
              uVar11 = (ulong)h->n_buckets;
            }
            h->vals[uVar11] = h->size - 1;
          }
        }
LAB_0011ea51:
        uVar16 = uVar16 + 1;
      } while (uVar16 != local_40);
    }
LAB_0011ea6e:
    if (local_b0 == 0) {
      local_b0 = 0;
      goto LAB_0011ea99;
    }
    do {
      if ((pcVar8[local_b0 - 1] != '\n') && (pcVar8[local_b0 - 1] != '\0')) goto LAB_0011ea99;
      local_b0 = local_b0 - 1;
    } while (local_b0 != 0);
  }
  local_b0 = 0;
LAB_0011ea99:
  uVar16 = local_b0 + 1;
  pcVar12 = pcVar8;
  if ((uVar16 < local_90) ||
     (uVar16 = uVar16 >> 1 | uVar16, uVar16 = uVar16 >> 2 | uVar16, uVar16 = uVar16 >> 4 | uVar16,
     uVar16 = uVar16 >> 8 | uVar16, pcVar12 = (char *)realloc(pcVar8,(uVar16 >> 0x10 | uVar16) + 1),
     pcVar12 != (char *)0x0)) {
    (pcVar12 + local_b0)[0] = '\n';
    (pcVar12 + local_b0)[1] = '\0';
    pcVar8 = pcVar12;
  }
  bcf_hdr_parse(hdr,pcVar8);
  free(pcVar8);
  free(__haystack);
  if (h != (kh_str2int_t *)0x0) {
    free(h->keys);
    free(h->flags);
    free(h->vals);
    free(h);
  }
  return hdr;
}

Assistant:

bcf_hdr_t *bcf_hdr_subset(const bcf_hdr_t *h0, int n, char *const* samples, int *imap)
{
    int hlen;
    void *names_hash = khash_str2int_init();
    char *htxt = bcf_hdr_fmt_text(h0, 1, &hlen);
    kstring_t str;
    bcf_hdr_t *h;
    str.l = str.m = 0; str.s = 0;
    h = bcf_hdr_init("w");
    bcf_hdr_set_version(h,bcf_hdr_get_version(h0));
    int j;
    for (j=0; j<n; j++) imap[j] = -1;
    if ( bcf_hdr_nsamples(h0) > 0) {
        char *p;
        int i = 0, end = n? 8 : 7;
        while ((p = strstr(htxt, "#CHROM\t")) != 0)
            if (p > htxt && *(p-1) == '\n') break;
        while ((p = strchr(p, '\t')) != 0 && i < end) ++i, ++p;
        if (i != end) {
            free(h); free(str.s);
            return 0; // malformated header
        }
        kputsn(htxt, p - htxt, &str);
        for (i = 0; i < n; ++i) {
            if ( khash_str2int_has_key(names_hash,samples[i]) )
            {
                fprintf(stderr,"[E::bcf_hdr_subset] Duplicate sample name \"%s\".\n", samples[i]);
                free(str.s);
                free(htxt);
                khash_str2int_destroy(names_hash);
                bcf_hdr_destroy(h);
                return NULL;
            }
            imap[i] = bcf_hdr_id2int(h0, BCF_DT_SAMPLE, samples[i]);
            if (imap[i] < 0) continue;
            kputc('\t', &str);
            kputs(samples[i], &str);
            khash_str2int_inc(names_hash,samples[i]);
        }
    } else kputsn(htxt, hlen, &str);
    while (str.l && (!str.s[str.l-1] || str.s[str.l-1]=='\n') ) str.l--; // kill trailing zeros and newlines
    kputc('\n',&str);
    bcf_hdr_parse(h, str.s);
    free(str.s);
    free(htxt);
    khash_str2int_destroy(names_hash);
    return h;
}